

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManCountDupLut(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int pFanins [3];
  
  Gia_ManCleanMark01(p);
  uVar7 = 0;
  iVar8 = 1;
  uVar10 = 0;
  uVar9 = 0;
  do {
    if (p->nObjs <= iVar8) {
      Gia_ManCleanMark01(p);
      uVar1 = uVar10 + uVar7;
      if (uVar1 + uVar9 != 0) {
        iVar8 = Gia_ManLutNum(p);
        printf("Dup fanins = %d.  CI fanins = %d.  MUX fanins = %d.  Total = %d.  (%.2f %%)\n",
               ((double)(int)(uVar1 + uVar9) * 100.0) / (double)iVar8,(ulong)uVar7,(ulong)uVar10,
               (ulong)uVar9,(ulong)uVar1);
      }
      return uVar1;
    }
    iVar2 = Gia_ObjIsLut(p,iVar8);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjLutIsMux(p,iVar8);
      if (iVar2 != 0) {
        pGVar3 = Gia_ManObj(p,iVar8);
        *(ulong *)pGVar3 = *(ulong *)pGVar3 | 0x4000000000000000;
        iVar2 = Gia_ObjLutSize(p,iVar8);
        if (iVar2 == 3) {
          Gia_ManPrintGetMuxFanins(p,pGVar3,pFanins);
          pGVar3 = Gia_ManObj(p,pFanins[1]);
          uVar6 = *(ulong *)pGVar3;
          *(ulong *)pGVar3 = uVar6 | 0x40000000;
          pGVar4 = Gia_ManObj(p,pFanins[2]);
          uVar5 = *(ulong *)pGVar4;
          uVar10 = uVar10 + (((uint)uVar6 & 0x9fffffff) == 0x9fffffff) +
                   (uint)(((uint)uVar5 & 0x9fffffff) == 0x9fffffff);
          uVar7 = uVar7 + ((uint)(uVar6 >> 0x1e) & 1) + (uint)(((uint)uVar5 >> 0x1e & 1) != 0);
          uVar9 = ((uint)(uVar6 >> 0x3e) & 1) + uVar9 + (uint)((uVar5 >> 0x3e & 1) != 0);
        }
        else {
          iVar2 = Gia_ObjLutSize(p,iVar8);
          if (iVar2 != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                          ,0x1bc,"int Gia_ManCountDupLut(Gia_Man_t *)");
          }
          uVar6 = (ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
          uVar5 = *(ulong *)(pGVar3 + -uVar6);
          if ((uVar5 & 0x4000000040000000) == 0) {
            pGVar4 = pGVar3 + -uVar6;
            uVar10 = uVar10 + (((uint)uVar5 & 0x9fffffff) == 0x9fffffff);
          }
          else {
            uVar5 = (ulong)((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff);
            pGVar4 = pGVar3 + -uVar5;
            uVar5 = *(ulong *)(pGVar3 + -uVar5);
            uVar10 = uVar10 + (((uint)uVar5 & 0x9fffffff) == 0x9fffffff);
            uVar7 = uVar7 + (((uint)uVar5 >> 0x1e & 1) != 0);
            uVar9 = uVar9 + ((uVar5 >> 0x3e & 1) != 0);
          }
        }
        *(ulong *)pGVar4 = uVar5 | 0x40000000;
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Gia_ManCountDupLut( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, pFanins[3], nCountDup = 0, nCountPis = 0, nCountMux = 0;
    Gia_ManCleanMark01( p );
    Gia_ManForEachLut( p, i )
        if ( Gia_ObjLutIsMux(p, i) )
        {
            pObj = Gia_ManObj( p, i );
            pObj->fMark1 = 1;
            if ( Gia_ObjLutSize(p, i) == 3 )
            {
                Gia_ManPrintGetMuxFanins( p, pObj, pFanins );

                pFanin = Gia_ManObj(p, pFanins[1]);
                nCountPis += Gia_ObjIsCi(pFanin);
                nCountDup += pFanin->fMark0;
                nCountMux += pFanin->fMark1;
                pFanin->fMark0 = 1;

                pFanin = Gia_ManObj(p, pFanins[2]);
                nCountPis += Gia_ObjIsCi(pFanin);
                nCountDup += pFanin->fMark0;
                nCountMux += pFanin->fMark1;
                pFanin->fMark0 = 1;
            }
            else if ( Gia_ObjLutSize(p, i) == 2 )
            {
                pFanin = Gia_ObjFanin0(pObj);
                if ( pFanin->fMark0 || pFanin->fMark1 )
                {
                    pFanin = Gia_ObjFanin1(pObj);
                    nCountPis += Gia_ObjIsCi(pFanin);
                    nCountDup += pFanin->fMark0;
                    nCountMux += pFanin->fMark1;
                    pFanin->fMark0 = 1;
                }
                else
                {
                    nCountPis += Gia_ObjIsCi(pFanin);
                    nCountDup += pFanin->fMark0;
                    nCountMux += pFanin->fMark1;
                    pFanin->fMark0 = 1;
                }
            }
            else assert( 0 );
        }
    Gia_ManCleanMark01( p );
    if ( nCountDup + nCountPis + nCountMux )
        printf( "Dup fanins = %d.  CI fanins = %d.  MUX fanins = %d.  Total = %d.  (%.2f %%)\n", 
            nCountDup, nCountPis, nCountMux, nCountDup + nCountPis, 100.0 * (nCountDup + nCountPis + nCountMux) / Gia_ManLutNum(p) );
    return nCountDup + nCountPis;
}